

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomExternalWrapperObject.cpp
# Opt level: O0

BOOL __thiscall
Js::CustomExternalWrapperObject::VerifyObjectAlive(CustomExternalWrapperObject *this)

{
  bool bVar1;
  BOOL BVar2;
  ScriptContext *this_00;
  ThreadContext *this_01;
  ScriptContext *scriptContext;
  CustomExternalWrapperObject *this_local;
  
  this_00 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  BVar2 = ScriptContext::VerifyAlive(this_00,0,(ScriptContext *)0x0);
  if (BVar2 == 0) {
    this_local._4_4_ = 0;
  }
  else {
    bVar1 = ScriptContext::IsInvalidatedForHostObjects(this_00);
    if (bVar1) {
      this_01 = ScriptContext::GetThreadContext(this_00);
      bVar1 = ThreadContext::RecordImplicitException(this_01);
      if (bVar1) {
        JavascriptError::MapAndThrowError(this_00,-0x7ff8fffb);
      }
      this_local._4_4_ = 0;
    }
    else {
      this_local._4_4_ = 1;
    }
  }
  return this_local._4_4_;
}

Assistant:

BOOL CustomExternalWrapperObject::VerifyObjectAlive()
{
    Js::ScriptContext* scriptContext = GetScriptContext();
    if (!scriptContext->VerifyAlive())
    {
        return FALSE;
    }

    // Perform an extended host object invalidation check only for external host objects.
    if (scriptContext->IsInvalidatedForHostObjects())
    {
        if (!scriptContext->GetThreadContext()->RecordImplicitException())
            return FALSE;
        Js::JavascriptError::MapAndThrowError(scriptContext, E_ACCESSDENIED);
    }
    return TRUE;
}